

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_init_frame_mt(AV1_PRIMARY *ppi,AV1_COMP *cpi)

{
  int iVar1;
  EncWorkerData *pEVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = (ppi->p_mt_info).num_workers;
  (cpi->mt_info).num_workers = iVar1;
  pEVar2 = (ppi->p_mt_info).tile_thr_data;
  (cpi->mt_info).workers = (ppi->p_mt_info).workers;
  (cpi->mt_info).tile_thr_data = pEVar2;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 1) {
    iVar4 = (ppi->p_mt_info).num_mod_workers[lVar3];
    if (iVar1 < iVar4) {
      iVar4 = iVar1;
    }
    (cpi->mt_info).num_mod_workers[lVar3] = iVar4;
  }
  return;
}

Assistant:

void av1_init_frame_mt(AV1_PRIMARY *ppi, AV1_COMP *cpi) {
  cpi->mt_info.workers = ppi->p_mt_info.workers;
  cpi->mt_info.num_workers = ppi->p_mt_info.num_workers;
  cpi->mt_info.tile_thr_data = ppi->p_mt_info.tile_thr_data;
  int i;
  for (i = MOD_FP; i < NUM_MT_MODULES; i++) {
    cpi->mt_info.num_mod_workers[i] =
        AOMMIN(cpi->mt_info.num_workers, ppi->p_mt_info.num_mod_workers[i]);
  }
}